

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,4,3,0,4,3>,Eigen::Block<Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,4,0,4,4>,0>const,4,3,false>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,_4,_3,_0,_4,_3> *dst,
               Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>
               *src,assign_op<float,_float> *func)

{
  DstEvaluatorType dstEvaluator;
  Kernel kernel;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType local_b0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
  local_a8;
  unary_evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>,_Eigen::internal::IndexBased,_float>
  local_88;
  
  unary_evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>,_Eigen::internal::IndexBased,_float>
  ::unary_evaluator(&local_88,src);
  local_a8.m_dst = &local_b0;
  local_b0.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>_>.m_d.data =
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>_>)
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>_>)dst;
  local_a8.m_src = (SrcEvaluatorType *)&local_88;
  local_a8.m_functor = func;
  local_a8.m_dstExpr = dst;
  copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_12>
  ::run(&local_a8);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}